

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_mpls_linktype(compiler_state_t *cstate,int proto)

{
  bpf_int32 v;
  block *b0;
  block *b1;
  
  if (proto == 2) {
    v = 0x40;
  }
  else {
    if (proto != 0x11) {
      abort();
    }
    v = 0x60;
  }
  b0 = gen_mcmp(cstate,OR_LINKPL,0xfffffffe,0x10,1,1);
  b1 = gen_mcmp(cstate,OR_LINKPL,0,0x10,v,0xf0);
  gen_and(b0,b1);
  return b1;
}

Assistant:

static struct block *
gen_mpls_linktype(compiler_state_t *cstate, int proto)
{
	struct block *b0, *b1;

        switch (proto) {

        case Q_IP:
                /* match the bottom-of-stack bit */
                b0 = gen_mcmp(cstate, OR_LINKPL, -2, BPF_B, 0x01, 0x01);
                /* match the IPv4 version number */
                b1 = gen_mcmp(cstate, OR_LINKPL, 0, BPF_B, 0x40, 0xf0);
                gen_and(b0, b1);
                return b1;

       case Q_IPV6:
                /* match the bottom-of-stack bit */
                b0 = gen_mcmp(cstate, OR_LINKPL, -2, BPF_B, 0x01, 0x01);
                /* match the IPv4 version number */
                b1 = gen_mcmp(cstate, OR_LINKPL, 0, BPF_B, 0x60, 0xf0);
                gen_and(b0, b1);
                return b1;

       default:
                abort();
        }
}